

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setparamscheck(HSQUIRRELVM v,SQInteger nparamscheck,SQChar *typemask)

{
  SQNativeClosure *pSVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  EVP_PKEY_CTX *src;
  SQRESULT SVar4;
  SQIntVec res;
  SQIntVec local_48;
  
  SVar4 = -1;
  pSVar3 = SQVM::GetUp(v,-1);
  if ((pSVar3->super_SQObject)._type == OT_NATIVECLOSURE) {
    pSVar1 = (pSVar3->super_SQObject)._unVal.pNativeClosure;
    pSVar1->_nparamscheck = nparamscheck;
    if (typemask == (SQChar *)0x0) {
      local_48._vals = (longlong *)0x0;
      sqvector<long_long>::resize(&pSVar1->_typecheck,0,(longlong *)&local_48);
    }
    else {
      local_48._vals = (longlong *)0x0;
      local_48._size = 0;
      local_48._allocated = 0;
      bVar2 = CompileTypemask(&local_48,typemask);
      if (!bVar2) {
        sq_throwerror(v,"invalid typemask");
        sqvector<long_long>::~sqvector(&local_48);
        return -1;
      }
      sqvector<long_long>::copy(&pSVar1->_typecheck,(EVP_PKEY_CTX *)&local_48,src);
      sqvector<long_long>::~sqvector(&local_48);
    }
    if (nparamscheck == -99999) {
      pSVar1->_nparamscheck = (pSVar1->_typecheck)._size;
    }
    SVar4 = 0;
  }
  else {
    sq_throwerror(v,"native closure expected");
  }
  return SVar4;
}

Assistant:

SQRESULT sq_setparamscheck(HSQUIRRELVM v,SQInteger nparamscheck,const SQChar *typemask)
{
    SQObject o = stack_get(v, -1);
    if(!sq_isnativeclosure(o))
        return sq_throwerror(v, _SC("native closure expected"));
    SQNativeClosure *nc = _nativeclosure(o);
    nc->_nparamscheck = nparamscheck;
    if(typemask) {
        SQIntVec res;
        if(!CompileTypemask(res, typemask))
            return sq_throwerror(v, _SC("invalid typemask"));
        nc->_typecheck.copy(res);
    }
    else {
        nc->_typecheck.resize(0);
    }
    if(nparamscheck == SQ_MATCHTYPEMASKSTRING) {
        nc->_nparamscheck = nc->_typecheck.size();
    }
    return SQ_OK;
}